

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void __thiscall higan::Logger::~Logger(Logger *this)

{
  size_t sVar1;
  ulong uVar2;
  char *local_20;
  unsigned_long local_18;
  
  (this->buffer_).buffer_[(this->buffer_).write_idx_] = '\n';
  uVar2 = (this->buffer_).write_idx_ + 1;
  if (0x1ff < uVar2) {
    uVar2 = 0x200;
  }
  sVar1 = (this->buffer_).read_idx_;
  (this->buffer_).write_idx_ = uVar2;
  local_20 = (this->buffer_).buffer_ + sVar1;
  local_18 = uVar2 - sVar1;
  if (g_output_func.super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*g_output_func._M_invoker)((_Any_data *)&g_output_func,&local_20,&local_18);
    if (this->level_ != FATAL) {
      return;
    }
  }
  std::function<void_()>::operator()(&g_flush_func);
  abort();
}

Assistant:

Logger::~Logger()
{
	*buffer_.WriteBegin() = '\n';
	buffer_.AddWriteIndex(1);

	g_output_func(buffer_.ReadBegin(), buffer_.ReadableSize());

	if (level_ == FATAL)
	{
		g_flush_func();
		abort();
	}
}